

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void __thiscall
glslang::TBuiltIns::add2ndGenerationSamplingImaging
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  TBuiltIns *this_00;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined8 in_R9;
  undefined7 uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  TSampler sampler;
  TString textureTypeName;
  TString typeName;
  TSampler local_e4;
  bool local_de;
  byte local_dd;
  EProfile local_dc;
  int local_d8;
  char local_d1;
  ulong local_d0;
  TBuiltIns *local_c8;
  ulong local_c0;
  uint local_b8;
  undefined4 local_b4;
  int local_b0;
  uint local_ac;
  uint local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  TString local_80;
  TString local_58;
  
  bVar13 = 0x135 < version || profile != EEsProfile;
  if (bVar13) {
    uVar8 = (undefined7)((ulong)in_R9 >> 8);
  }
  else {
    uVar8 = 0;
  }
  local_de = 0x135 >= version && profile == EEsProfile || version < 0x82 && profile != EEsProfile;
  local_dd = version < 0x1c2 || profile == EEsProfile;
  local_d0 = 0;
  local_b4 = (undefined4)CONCAT71(uVar8,~(bVar13 && (0x8b < version || profile == EEsProfile)));
  local_dc = profile;
  local_d8 = version;
  local_c8 = this;
  do {
    uVar3 = 0;
    do {
      local_a8 = (uint)uVar3 | (uint)local_d0;
      local_a4 = (uint)((uint)uVar3 != 0) << 0x11;
      uVar1 = 0;
      local_90 = uVar3;
      do {
        local_c0 = (ulong)uVar1;
        if ((uint)uVar3 == 0 || uVar1 == 0 && (uint)local_d0 == 0) {
          bVar13 = uVar1 == 0;
          bVar14 = profile != EEsProfile;
          if (((0x135 < version || (bVar14 || bVar13)) && (0x8b < version || (!bVar14 || bVar13)))
             && (bVar14 || ((uint)local_d0 == 0 || bVar13))) {
            local_a0 = uVar1 | (uint)uVar3;
            local_ac = (uint)(uVar1 != 0) * 0x40000;
            local_88 = (ulong)local_ac;
            local_ac = local_ac + 0x1f080700;
            uVar6 = 0;
            uVar7 = local_b4;
            do {
              uVar1 = local_a8;
              uVar5 = (uint)uVar6;
              local_9c = local_a0 | uVar5;
              local_d1 = (profile == EEsProfile && version < 0x136) &&
                         ((int)local_c0 != 0 && uVar5 != 0);
              iVar4 = 1;
              local_b0 = (uint)(uVar5 != 0) * 0x10000 + local_a4 + (int)local_88;
              uVar10 = local_c0;
              bVar9 = local_dd;
              local_98 = uVar6;
              do {
                if (iVar4 != 8) {
                  if (((((spvVersion->vulkan != 0 || iVar4 != 7) &&
                        (iVar4 != 7 || uVar1 == 0 && uVar5 == 0)) &&
                       (uVar6 = (ulong)(profile ^ EEsProfile),
                       ((iVar4 - 1U & 0xfffffffb) == 0 && (profile ^ EEsProfile) == EBadProfile) !=
                       (uVar1 == 0 && uVar5 == 0 || iVar4 != 7))) &&
                      ((((int)uVar10 == 0 || (iVar4 == 7)) || (iVar4 == 2)))) &&
                     (((((byte)uVar7 & iVar4 == 6) == 0 &&
                       ((local_9c == 0 || iVar4 != 6) && local_d1 == '\0')) &&
                      ((int)uVar3 == 0 || iVar4 != 3)))) {
                    if (((int)local_98 == 0) ||
                       ((iVar4 != 3 && iVar4 != 5) && (iVar4 == 4 & local_de) == 0)) {
                      local_b8 = iVar4 << 8;
                      uVar12 = 0xffffffffffffffff;
                      lVar11 = 0;
                      do {
                        if (((bVar9 & lVar11 == 0xc) == 0) &&
                           ((((iVar4 != 5 || (0x8b < version)) || (lVar11 == 0)) &&
                            ((int)uVar3 == 0 || 1 < uVar12)))) {
                          uVar2 = (uint)local_e4 & 0x80000000;
                          bVar9 = (&DAT_0086d740)[lVar11];
                          if (iVar4 == 7) {
                            local_e4 = (TSampler)(bVar9 | local_ac | uVar2);
                          }
                          else if ((uint)local_d0 == 0) {
                            local_e4 = (TSampler)
                                       ((bVar9 | local_b8) + local_b0 | uVar2 | 0x1f100000);
                          }
                          else {
                            local_e4 = (TSampler)
                                       ((bVar9 | local_b8) + local_b0 | uVar2 | 0x1f080000);
                          }
                          TSampler::getString_abi_cxx11_(&local_58,&local_e4);
                          if (iVar4 == 7) {
                            addSubpassSampling(local_c8,local_e4,&local_58,uVar2,(EProfile)uVar6);
                            uVar3 = local_90;
                            uVar10 = local_c0;
                            version = local_d8;
                            profile = local_dc;
                            uVar7 = local_b4;
                            bVar9 = local_dd;
                          }
                          else {
                            addQueryFunctions(local_c8,local_e4,&local_58,local_d8,local_dc);
                            if ((uint)local_d0 == 0) {
                              addSamplingFunctions(local_c8,local_e4,&local_58,local_d8,local_dc);
                              uVar6 = (ulong)local_dc;
                              addGatherFunctions(local_c8,local_e4,&local_58,local_d8,local_dc);
                              uVar3 = local_90;
                              uVar10 = local_c0;
                              version = local_d8;
                              profile = local_dc;
                              uVar7 = local_b4;
                              bVar9 = local_dd;
                              if ((0 < spvVersion->vulkan) &&
                                 (((uint)local_e4 & 0x120000) == 0x100000)) {
                                local_e4 = (TSampler)((uint)local_e4 & 0x8005ffff | 0x1f000000);
                                TSampler::getString_abi_cxx11_(&local_80,&local_e4);
                                this_00 = local_c8;
                                addSamplingFunctions(local_c8,local_e4,&local_80,local_d8,local_dc);
                                uVar6 = (ulong)local_dc;
                                addQueryFunctions(this_00,local_e4,&local_80,local_d8,local_dc);
                                uVar3 = local_90;
                                uVar10 = local_c0;
                                version = local_d8;
                                profile = local_dc;
                                uVar7 = local_b4;
                                bVar9 = local_dd;
                              }
                            }
                            else {
                              uVar6 = (ulong)local_dc;
                              addImageFunctions(local_c8,local_e4,&local_58,local_d8,local_dc);
                              uVar3 = local_90;
                              uVar10 = local_c0;
                              version = local_d8;
                              profile = local_dc;
                              uVar7 = local_b4;
                              bVar9 = local_dd;
                            }
                          }
                        }
                        lVar11 = lVar11 + 4;
                        uVar12 = uVar12 + 1;
                      } while (lVar11 != 0x10);
                    }
                  }
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 != 9);
              uVar6 = (ulong)((int)local_98 + 1);
            } while ((int)local_98 == 0);
          }
        }
        uVar1 = (int)local_c0 + 1;
      } while ((int)local_c0 == 0);
      iVar4 = (int)uVar3;
      uVar3 = (ulong)(iVar4 + 1);
    } while (iVar4 == 0);
    iVar4 = (int)local_d0;
    local_d0 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  if (0x1c1 < version && profile != EEsProfile) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&(local_c8->super_TBuiltInParseables).commonBuiltins,
               "bool sparseTexelsResidentARB(int code);\n");
  }
  return;
}

Assistant:

void TBuiltIns::add2ndGenerationSamplingImaging(int version, EProfile profile, const SpvVersion& spvVersion)
{
    //
    // In this function proper, enumerate the types, then calls the next set of functions
    // to enumerate all the uses for that type.
    //

    // enumerate all the types
    const TBasicType bTypes[] = { EbtFloat, EbtInt, EbtUint,
         EbtFloat16
    };
    bool skipBuffer = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 140);
    bool skipCubeArrayed = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 130);
    for (int image = 0; image <= 1; ++image) // loop over "bool" image vs sampler
    {
        for (int shadow = 0; shadow <= 1; ++shadow) { // loop over "bool" shadow or not
            for (int ms = 0; ms <= 1; ++ms) // loop over "bool" multisample or not
            {
                if ((ms || image) && shadow)
                    continue;
                if (ms && profile != EEsProfile && version < 140)
                    continue;
                if (ms && image && profile == EEsProfile)
                    continue;
                if (ms && profile == EEsProfile && version < 310)
                    continue;

                for (int arrayed = 0; arrayed <= 1; ++arrayed) { // loop over "bool" arrayed or not
                    for (int dim = Esd1D; dim < EsdNumDims; ++dim) { // 1D, ..., buffer, subpass
                        if (dim == EsdAttachmentEXT)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim != Esd2D && dim != EsdSubpass && ms)
                            continue;
                        if (dim == EsdBuffer && skipBuffer)
                            continue;
                        if (dim == EsdBuffer && (shadow || arrayed || ms))
                            continue;
                        if (ms && arrayed && profile == EEsProfile && version < 310)
                            continue;
                        if (dim == Esd3D && shadow)
                            continue;
                        if (dim == EsdCube && arrayed && skipCubeArrayed)
                            continue;
                        if ((dim == Esd3D || dim == EsdRect) && arrayed)
                            continue;

                        // Loop over the bTypes
                        for (size_t bType = 0; bType < sizeof(bTypes)/sizeof(TBasicType); ++bType) {
                            if (bTypes[bType] == EbtFloat16 && (profile == EEsProfile || version < 450))
                                continue;
                            if (dim == EsdRect && version < 140 && bType > 0)
                                continue;
                            if (shadow && (bTypes[bType] == EbtInt || bTypes[bType] == EbtUint))
                                continue;
                            //
                            // Now, make all the function prototypes for the type we just built...
                            //
                            TSampler sampler;
                            if (dim == EsdSubpass) {
                                sampler.setSubpass(bTypes[bType], ms ? true : false);
                            } else if (dim == EsdAttachmentEXT) {
                                sampler.setAttachmentEXT(bTypes[bType]);
                            } else
                            if (image) {
                                sampler.setImage(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                                  shadow  ? true : false,
                                                                                  ms      ? true : false);
                            } else {
                                sampler.set(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                             shadow  ? true : false,
                                                                             ms      ? true : false);
                            }

                            TString typeName = sampler.getString();

                            if (dim == EsdSubpass) {
                                addSubpassSampling(sampler, typeName, version, profile);
                                continue;
                            }

                            addQueryFunctions(sampler, typeName, version, profile);

                            if (image)
                                addImageFunctions(sampler, typeName, version, profile);
                            else {
                                addSamplingFunctions(sampler, typeName, version, profile);
                                addGatherFunctions(sampler, typeName, version, profile);
                                if (spvVersion.vulkan > 0 && sampler.isCombined() && !sampler.shadow) {
                                    // Base Vulkan allows texelFetch() for
                                    // textureBuffer (i.e. without sampler).
                                    //
                                    // GL_EXT_samplerless_texture_functions
                                    // allows texelFetch() and query functions
                                    // (other than textureQueryLod()) for all
                                    // texture types.
                                    sampler.setTexture(sampler.type, sampler.dim, sampler.arrayed, sampler.shadow,
                                                       sampler.ms);
                                    TString textureTypeName = sampler.getString();
                                    addSamplingFunctions(sampler, textureTypeName, version, profile);
                                    addQueryFunctions(sampler, textureTypeName, version, profile);
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    //
    // sparseTexelsResidentARB()
    //
    if (profile != EEsProfile && version >= 450) {
        commonBuiltins.append("bool sparseTexelsResidentARB(int code);\n");
    }
}